

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_misc.h
# Opt level: O0

void * mbedtls_ssl_get_groups(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (ssl->handshake->group_list == (uint16_t *)0x0)) {
    ssl_local = (mbedtls_ssl_context *)ssl->conf->group_list;
  }
  else {
    ssl_local = (mbedtls_ssl_context *)ssl->handshake->group_list;
  }
  return ssl_local;
}

Assistant:

static inline const void *mbedtls_ssl_get_groups(const mbedtls_ssl_context *ssl)
{
    #if defined(MBEDTLS_DEPRECATED_REMOVED) || !defined(MBEDTLS_ECP_C)
    return ssl->conf->group_list;
    #else
    if ((ssl->handshake != NULL) && (ssl->handshake->group_list != NULL)) {
        return ssl->handshake->group_list;
    } else {
        return ssl->conf->group_list;
    }
    #endif
}